

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__pnm_getinteger(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  iVar3 = 0;
  while( true ) {
    iVar2 = stbi__at_eof(s);
    if (iVar2 != 0) {
      return iVar3;
    }
    if ((byte)(*c - 0x3aU) < 0xf6) break;
    iVar3 = iVar3 * 10 + (uint)(byte)*c + -0x30;
    sVar1 = stbi__get8(s);
    *c = sVar1;
    if ((0xccccccc < iVar3) || ('7' < (char)sVar1 && iVar3 == 0xccccccc)) {
      *(char **)(in_FS_OFFSET + -0x68) =
           "Parsing an integer in the PPM header overflowed a 32-bit int";
      return 0;
    }
  }
  return iVar3;
}

Assistant:

static int      stbi__pnm_getinteger(stbi__context *s, char *c)
{
   int value = 0;

   while (!stbi__at_eof(s) && stbi__pnm_isdigit(*c)) {
      value = value*10 + (*c - '0');
      *c = (char) stbi__get8(s);
      if((value > 214748364) || (value == 214748364 && *c > '7'))
          return stbi__err("integer parse overflow", "Parsing an integer in the PPM header overflowed a 32-bit int");
   }

   return value;
}